

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localpointer.h
# Opt level: O0

void __thiscall
icu_63::LocalPointer<icu_63::UVector32>::adoptInsteadAndCheckErrorCode
          (LocalPointer<icu_63::UVector32> *this,UVector32 *p,UErrorCode *errorCode)

{
  UVector32 *pUVar1;
  UBool UVar2;
  UErrorCode *errorCode_local;
  UVector32 *p_local;
  LocalPointer<icu_63::UVector32> *this_local;
  
  UVar2 = ::U_SUCCESS(*errorCode);
  if (UVar2 == '\0') {
    if (p != (UVector32 *)0x0) {
      (*(p->super_UObject)._vptr_UObject[1])();
    }
  }
  else {
    pUVar1 = (this->super_LocalPointerBase<icu_63::UVector32>).ptr;
    if (pUVar1 != (UVector32 *)0x0) {
      (*(pUVar1->super_UObject)._vptr_UObject[1])();
    }
    (this->super_LocalPointerBase<icu_63::UVector32>).ptr = p;
    if (p == (UVector32 *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return;
}

Assistant:

void adoptInsteadAndCheckErrorCode(T *p, UErrorCode &errorCode) {
        if(U_SUCCESS(errorCode)) {
            delete LocalPointerBase<T>::ptr;
            LocalPointerBase<T>::ptr=p;
            if(p==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
            }
        } else {
            delete p;
        }
    }